

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.c
# Opt level: O3

void init_view(void)

{
  long lVar1;
  
  viewnum = 0;
  lVar1 = 0;
  do {
    *(undefined8 *)((long)viewinfo[0].pos + lVar1) = 0;
    *(undefined8 *)((long)viewinfo[0].pos + lVar1 + 8) = 0;
    *(undefined8 *)((long)viewinfo[0].vel + lVar1) = 0;
    *(undefined8 *)((long)viewinfo[0].vel + lVar1 + 8) = 0;
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0x80);
  return;
}

Assistant:

void init_view()
{
   int i, j;

   viewnum = 0;

   for (i=0; i<4; i++) {
      for (j=0; j<4; j++) {
	 viewinfo[i].pos[j] = 0;
	 viewinfo[i].vel[j] = 0;
      }
   }
}